

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

SMatrix<double,_3,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator/=(SMatrix<double,_3,_3> *this,double s)

{
  SMatrix<double,_3,_3> *pSVar1;
  int k;
  long lVar2;
  int i;
  long lVar3;
  
  pSVar1 = this;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(double (*) [3])*(double (*) [3])this)[lVar3] =
           (*(double (*) [3])*(double (*) [3])this)[lVar3] / s;
    }
    this = (SMatrix<double,_3,_3> *)((long)this + 0x18);
  }
  return pSVar1;
}

Assistant:

SMatrix<T, nrows, ncols> &operator/=(T s)
    {
      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          v[k][i]/=s;
        }

      return *this;
    }